

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHash
          (HashingClauseVariantIndex *this,Literal **lits,uint length)

{
  RangeIterator<unsigned_int> it_00;
  VariableIgnoringComparator __comp;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *__last;
  Stack<unsigned_char> *this_00;
  uint *puVar4;
  Stack<unsigned_char> *obj;
  uint in_EDX;
  Literal **in_RSI;
  undefined8 in_RDI;
  RangeIterator<unsigned_int> RVar5;
  Iterator it;
  uint li;
  uint i;
  uint hash;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Stack<unsigned_int> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  Stack<unsigned_int> *in_stack_ffffffffffffff70;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  VarCounts *in_stack_ffffffffffffff88;
  Literal *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint local_60;
  uint local_5c;
  VariableIgnoringComparator local_58;
  undefined8 local_50;
  uint local_48;
  RangeIterator<unsigned_int> local_40;
  undefined8 local_30;
  uint local_28;
  uint local_14;
  Literal **local_10;
  
  uVar6 = (undefined4)in_RDI;
  uVar7 = (undefined4)((ulong)in_RDI >> 0x20);
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (computeHash(Kernel::Literal_const**,unsigned_int)::litOrder == '\0') {
    iVar2 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::litOrder);
    if (iVar2 != 0) {
      Lib::Stack<unsigned_int>::Stack(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      __cxa_atexit(Lib::Stack<unsigned_int>::~Stack,&computeHash::litOrder,&__dso_handle);
      __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::litOrder);
    }
  }
  uVar3 = (uint)in_stack_ffffffffffffff68;
  Lib::Stack<unsigned_int>::reset(&computeHash::litOrder);
  RVar5 = Lib::getRangeIterator<unsigned_int>
                    (uVar3,(uint)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  local_40._0_8_ = RVar5._0_8_;
  local_30._0_4_ = local_40._next;
  local_30._4_4_ = local_40._from;
  local_40._to = RVar5._to;
  local_28 = local_40._to;
  local_50._0_4_ = local_40._next;
  local_50._4_4_ = local_40._from;
  local_48 = local_40._to;
  it_00._from = in_stack_ffffffffffffff80;
  it_00._next = uVar7;
  it_00._to = in_stack_ffffffffffffff84;
  local_40 = RVar5;
  Lib::Stack<unsigned_int>::loadFromIterator<Lib::RangeIterator<unsigned_int>>
            (in_stack_ffffffffffffff60,it_00);
  __last = Lib::Stack<unsigned_int>::begin(&computeHash::litOrder);
  this_00 = (Stack<unsigned_char> *)Lib::Stack<unsigned_int>::end(&computeHash::litOrder);
  VariableIgnoringComparator::VariableIgnoringComparator(&local_58,local_10);
  __comp._lits._4_4_ = in_stack_ffffffffffffff84;
  __comp._lits._0_4_ = in_stack_ffffffffffffff80;
  std::sort<unsigned_int*,Indexing::HashingClauseVariantIndex::VariableIgnoringComparator>
            ((uint *)CONCAT44(uVar7,uVar6),(uint *)this_00,__comp);
  if (computeHash(Kernel::Literal_const**,unsigned_int)::varCnts == '\0') {
    iVar2 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::varCnts);
    if (iVar2 != 0) {
      Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                (&computeHash::varCnts);
      __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::
                   ~DHMap,&computeHash::varCnts,&__dso_handle);
      __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::varCnts);
    }
  }
  Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&computeHash::varCnts);
  local_5c = 0x811c9dc5;
  for (local_60 = 0; local_60 < local_14; local_60 = local_60 + 1) {
    puVar4 = Lib::Stack<unsigned_int>::operator[](&computeHash::litOrder,(ulong)local_60);
    local_5c = computeHashAndCountVariables
                         ((HashingClauseVariantIndex *)CONCAT44(*puVar4,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff84);
  }
  uVar3 = Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::size
                    (&computeHash::varCnts);
  if (uVar3 != 0) {
    if (computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram == '\0') {
      iVar2 = __cxa_guard_acquire(&computeHash(Kernel::Literal_const**,unsigned_int)::
                                   varCntHistogram);
      if (iVar2 != 0) {
        Lib::Stack<unsigned_char>::Stack(this_00,(size_t)__last);
        __cxa_atexit(Lib::Stack<unsigned_char>::~Stack,&computeHash::varCntHistogram,&__dso_handle);
        __cxa_guard_release(&computeHash(Kernel::Literal_const**,unsigned_int)::varCntHistogram);
      }
    }
    Lib::Stack<unsigned_char>::reset(&computeHash::varCntHistogram);
    Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::Iterator
              ((Iterator *)in_stack_ffffffffffffff60,
               (DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while( true ) {
      bVar1 = Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator
              ::hasNext((Iterator *)0x2feaa8);
      if (!bVar1) break;
      Lib::DHMap<unsigned_int,_unsigned_char,_Lib::DefaultHash,_Lib::DefaultHash2>::Iterator::next
                ((Iterator *)0x2feab8);
      Lib::Stack<unsigned_char>::push
                ((Stack<unsigned_char> *)in_stack_ffffffffffffff60,
                 (uchar)(in_stack_ffffffffffffff5c >> 0x18));
    }
    obj = (Stack<unsigned_char> *)Lib::Stack<unsigned_char>::begin(&computeHash::varCntHistogram);
    Lib::Stack<unsigned_char>::end(&computeHash::varCntHistogram);
    std::sort<unsigned_char*>((uchar *)this_00,(uchar *)__last);
    local_5c = Lib::DefaultHash::hash<unsigned_char>(obj,in_stack_ffffffffffffff5c);
  }
  return local_5c;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHash(Literal* const * lits, unsigned length)
{
  // cout << "length " <<  length << endl;

  TIME_TRACE("hvci compute hash");

  static Stack<unsigned> litOrder;
  litOrder.reset();
  litOrder.loadFromIterator(getRangeIterator(0u,length));

  std::sort(litOrder.begin(), litOrder.end(), VariableIgnoringComparator(lits));

  static VarCounts varCnts;
  varCnts.reset();

  unsigned hash = 2166136261u;
  for(unsigned i=0; i<length; i++) {
    unsigned li = litOrder[i];
    hash = computeHashAndCountVariables(lits[li],varCnts,hash);
  }

  if (varCnts.size() > 0) {
    static Stack<unsigned char> varCntHistogram;
    varCntHistogram.reset();
    VarCounts::Iterator it(varCnts);
    while (it.hasNext()) {
      varCntHistogram.push(it.next());
    }

    std::sort(varCntHistogram.begin(),varCntHistogram.end());
    hash = DefaultHash::hash(varCntHistogram, hash);
  }

  return hash;
}